

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O0

void init_driver(audit_regressor_data *dat)

{
  long *plVar1;
  byte bVar2;
  _Setw _Var3;
  undefined8 uVar4;
  vw_exception *this;
  ostream *poVar5;
  long *in_RDI;
  stringstream __msg_1;
  size_t n;
  stringstream __msg;
  typed_option<unsigned_int> *in_stack_fffffffffffffad0;
  string *in_stack_fffffffffffffae8;
  undefined8 in_stack_fffffffffffffaf0;
  int plineNumber;
  string *in_stack_fffffffffffffaf8;
  audit_regressor_data *in_stack_fffffffffffffb00;
  sparse_parameters *in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb10;
  uint in_stack_fffffffffffffb14;
  byte local_48a;
  stringstream local_420 [16];
  ostream local_410;
  allocator local_291;
  string local_290 [32];
  sparse_parameters *local_270;
  allocator local_261;
  string local_260 [39];
  undefined1 local_239;
  stringstream local_218 [16];
  ostream local_208;
  byte local_8b;
  byte local_8a;
  allocator local_89;
  string local_88 [37];
  byte local_63;
  byte local_62;
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [32];
  long *local_8;
  
  plineNumber = (int)((ulong)in_stack_fffffffffffffaf0 >> 0x20);
  plVar1 = *(long **)(*in_RDI + 0x278);
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  local_62 = 0;
  local_63 = 0;
  local_8a = 0;
  local_8b = 0;
  std::__cxx11::string::string(local_28,"cache_file",&local_29);
  bVar2 = (**(code **)(*plVar1 + 8))(plVar1,local_28);
  if ((bVar2 & 1) == 0) {
    plVar1 = *(long **)(*local_8 + 0x278);
    std::allocator<char>::allocator();
    local_62 = 1;
    std::__cxx11::string::string(local_60,"cache",&local_61);
    local_63 = 1;
    bVar2 = (**(code **)(*plVar1 + 8))(plVar1,local_60);
    local_48a = 0;
    if ((bVar2 & 1) == 0) goto LAB_002ff387;
  }
  plVar1 = *(long **)(*local_8 + 0x278);
  std::allocator<char>::allocator();
  local_8a = 1;
  std::__cxx11::string::string(local_88,"kill_cache",&local_89);
  local_8b = 1;
  local_48a = (**(code **)(*plVar1 + 8))(plVar1,local_88);
  local_48a = local_48a ^ 0xff;
LAB_002ff387:
  if ((local_8b & 1) != 0) {
    std::__cxx11::string::~string(local_88);
  }
  if ((local_8a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
  }
  if ((local_63 & 1) != 0) {
    std::__cxx11::string::~string(local_60);
  }
  if ((local_62 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  if ((local_48a & 1) != 0) {
    std::__cxx11::stringstream::stringstream(local_218);
    std::operator<<(&local_208,
                    "audit_regressor is incompatible with a cache file.  Use it in single pass mode only."
                   );
    local_239 = 1;
    uVar4 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              ((vw_exception *)in_stack_fffffffffffffb00,(char *)in_stack_fffffffffffffaf8,
               plineNumber,in_stack_fffffffffffffae8);
    local_239 = 0;
    __cxa_throw(uVar4,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  *(undefined4 *)(*(long *)*local_8 + 0x50) = 0x3f800000;
  *(undefined8 *)(*(long *)*local_8 + 8) = 0;
  local_8[1] = *(ulong *)(*(long *)(*local_8 + 0x28) + 0xe0) /
               *(ulong *)(*(long *)(*local_8 + 0x28) + 0xd8);
  local_8[3] = *(long *)(*(long *)(*local_8 + 0x28) + 0xd8);
  plVar1 = *(long **)(*local_8 + 0x278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_260,"csoaa",&local_261);
  bVar2 = (**(code **)(*plVar1 + 8))(plVar1,local_260);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  if ((bVar2 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_290,"csoaa",&local_291);
    VW::config::options_i::get_typed_option<unsigned_int>
              ((options_i *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    in_stack_fffffffffffffb14 =
         VW::config::typed_option<unsigned_int>::value(in_stack_fffffffffffffad0);
    in_stack_fffffffffffffb08 = (sparse_parameters *)(ulong)in_stack_fffffffffffffb14;
    std::__cxx11::string::~string(local_290);
    std::allocator<char>::~allocator((allocator<char> *)&local_291);
    local_270 = in_stack_fffffffffffffb08;
    if (in_stack_fffffffffffffb08 != (sparse_parameters *)local_8[3]) {
      local_8[3] = (long)in_stack_fffffffffffffb08;
      local_8[1] = *(ulong *)(*(long *)(*local_8 + 0x28) + 0xe0) / (ulong)in_stack_fffffffffffffb08;
    }
  }
  if ((*(byte *)(*local_8 + 0x3590) & 1) == 0) {
    regressor_values<dense_parameters>
              (in_stack_fffffffffffffb00,(dense_parameters *)in_stack_fffffffffffffaf8);
  }
  else {
    regressor_values<sparse_parameters>
              ((audit_regressor_data *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10)
               ,in_stack_fffffffffffffb08);
  }
  if (local_8[6] != 0) {
    if ((*(byte *)(*local_8 + 0x3439) & 1) == 0) {
      poVar5 = std::operator<<((ostream *)(*local_8 + 0xe0),"Regressor contains ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_8[6]);
      std::operator<<(poVar5," values\n");
      poVar5 = (ostream *)std::ostream::operator<<((void *)(*local_8 + 0xe0),std::left);
      _Var3 = std::setw(0xc);
      poVar5 = std::operator<<(poVar5,_Var3);
      poVar5 = std::operator<<(poVar5,"example");
      poVar5 = std::operator<<(poVar5," ");
      _Var3 = std::setw(0xe);
      poVar5 = std::operator<<(poVar5,_Var3);
      poVar5 = std::operator<<(poVar5,"values");
      poVar5 = std::operator<<(poVar5," ");
      _Var3 = std::setw(8);
      poVar5 = std::operator<<(poVar5,_Var3);
      poVar5 = std::operator<<(poVar5,"total");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = (ostream *)std::ostream::operator<<((void *)(*local_8 + 0xe0),std::left);
      _Var3 = std::setw(0xc);
      poVar5 = std::operator<<(poVar5,_Var3);
      poVar5 = std::operator<<(poVar5,"counter");
      poVar5 = std::operator<<(poVar5," ");
      _Var3 = std::setw(0xe);
      poVar5 = std::operator<<(poVar5,_Var3);
      poVar5 = std::operator<<(poVar5,"audited");
      poVar5 = std::operator<<(poVar5," ");
      _Var3 = std::setw(8);
      poVar5 = std::operator<<(poVar5,_Var3);
      poVar5 = std::operator<<(poVar5,"progress");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    return;
  }
  std::__cxx11::stringstream::stringstream(local_420);
  std::operator<<(&local_410,"regressor has no non-zero weights. Nothing to audit.");
  this = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  VW::vw_exception::vw_exception
            (this,(char *)in_stack_fffffffffffffaf8,plineNumber,in_stack_fffffffffffffae8);
  __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void init_driver(audit_regressor_data& dat)
{
  // checks a few settings that might be applied after audit_regressor_setup() is called
  if ((dat.all->options->was_supplied("cache_file") || dat.all->options->was_supplied("cache")) &&
      !dat.all->options->was_supplied("kill_cache"))
  {
    THROW("audit_regressor is incompatible with a cache file.  Use it in single pass mode only.");
  }

  dat.all->sd->dump_interval = 1.;  // regressor could initialize these if saved with --save_resume
  dat.all->sd->example_number = 0;

  dat.increment = dat.all->l->increment / dat.all->l->weights;
  dat.total_class_cnt = dat.all->l->weights;

  if (dat.all->options->was_supplied("csoaa"))
  {
    size_t n = dat.all->options->get_typed_option<uint32_t>("csoaa").value();
    if (n != dat.total_class_cnt)
    {
      dat.total_class_cnt = n;
      dat.increment = dat.all->l->increment / n;
    }
  }

  // count non-null feature values in regressor
  if (dat.all->weights.sparse)
    regressor_values(dat, dat.all->weights.sparse_weights);
  else
    regressor_values(dat, dat.all->weights.dense_weights);

  if (dat.loaded_regressor_values == 0)
    THROW("regressor has no non-zero weights. Nothing to audit.");

  if (!dat.all->quiet)
  {
    dat.all->trace_message << "Regressor contains " << dat.loaded_regressor_values << " values\n";
    dat.all->trace_message << std::left << std::setw(shared_data::col_example_counter) << "example"
                           << " " << std::setw(shared_data::col_example_weight) << "values"
                           << " " << std::setw(shared_data::col_current_label) << "total" << std::endl;
    dat.all->trace_message << std::left << std::setw(shared_data::col_example_counter) << "counter"
                           << " " << std::setw(shared_data::col_example_weight) << "audited"
                           << " " << std::setw(shared_data::col_current_label) << "progress" << std::endl;
  }
}